

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_interpreted.cpp
# Opt level: O2

void __thiscall
defyx::InterpretedVm<defyx::AlignedAllocator<64UL>,_false>::execute
          (InterpretedVm<defyx::AlignedAllocator<64UL>,_false> *this)

{
  ProgramConfiguration *config;
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint i_1;
  long lVar8;
  uint i;
  uint ic;
  int iVar9;
  uint uVar10;
  addr_t aVar11;
  ulong uVar12;
  ulong uVar13;
  NativeRegisterFile nreg;
  undefined8 uStack_38;
  
  nreg.r[6] = 0;
  nreg.r[7] = 0;
  nreg.r[4] = 0;
  nreg.r[5] = 0;
  nreg.r[2] = 0;
  nreg.r[3] = 0;
  nreg.r[0] = 0;
  nreg.r[1] = 0;
  for (lVar8 = -0x40; lVar8 != 0; lVar8 = lVar8 + 0x10) {
    puVar1 = (undefined8 *)
             ((long)(this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.config
                    .eMask + lVar8);
    uVar3 = puVar1[1];
    *(undefined8 *)((long)&uStack_38 + lVar8) = *puVar1;
    *(undefined8 *)(&stack0xffffffffffffffd0 + lVar8) = uVar3;
  }
  BytecodeMachine::compileProgram
            ((BytecodeMachine *)
             &(this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.field_0x428,
             &(this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.program,
             this->bytecode,&nreg);
  aVar11 = (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.mem.mx;
  uVar10 = (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.mem.ma;
  config = &(this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.config;
  for (iVar9 = 0; iVar9 != 0x400; iVar9 = iVar9 + 1) {
    uVar13 = nreg.r[(this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.config
                    .readReg1] ^
             nreg.r[(this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.config
                    .readReg0];
    uVar12 = (ulong)((aVar11 ^ (uint)uVar13) & 0x3ffc0);
    puVar5 = (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.scratchpad;
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      nreg.r[lVar8] = nreg.r[lVar8] ^ *(ulong *)(puVar5 + lVar8 * 8 + uVar12);
    }
    uVar13 = (ulong)(((uint)(uVar13 >> 0x20) ^ uVar10) & 0x3ffc0);
    for (lVar8 = 0x20; lVar8 != 0x40; lVar8 = lVar8 + 8) {
      uVar3 = *(undefined8 *)(puVar5 + lVar8 + (uVar13 - 0x20));
      *(double *)((long)nreg.r + lVar8 * 2) = (double)(int)uVar3;
      *(double *)((long)nreg.r + lVar8 * 2 + 8) = (double)(int)((ulong)uVar3 >> 0x20);
    }
    uVar6 = config->eMask[0];
    uVar7 = (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.config.eMask
            [1];
    for (lVar8 = 0x40; lVar8 != 0x60; lVar8 = lVar8 + 8) {
      uVar3 = *(undefined8 *)(puVar5 + lVar8 + (uVar13 - 0x20));
      *(ulong *)((long)nreg.r + lVar8 * 2) = (ulong)(double)(int)uVar3 & 0xffffffffffffff | uVar6;
      *(ulong *)((long)nreg.r + lVar8 * 2 + 8) =
           (ulong)(double)(int)((ulong)uVar3 >> 0x20) & 0xffffffffffffff | uVar7;
    }
    BytecodeMachine::executeBytecode(this->bytecode,puVar5,config);
    uVar10 = ((uint)nreg.r[(this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm
                           .config.readReg3] ^
              (uint)nreg.r[(this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm
                           .config.readReg2] ^
             (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.mem.mx) &
             0x1ffffc0;
    (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.mem.mx = uVar10;
    (*(this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm._vptr_defyx_vm[9])
              (this,(ulong)uVar10 +
                    (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.
                    datasetOffset);
    (*(this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm._vptr_defyx_vm[8])
              (this,(ulong)(this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm
                           .mem.ma +
                    (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.
                    datasetOffset,&nreg);
    uVar2 = (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.mem.mx;
    uVar4 = (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.mem.ma;
    (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.mem.mx = uVar4;
    (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.mem.ma = uVar2;
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      *(int_reg_t *)
       ((this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.scratchpad +
       lVar8 * 8 + uVar13) = nreg.r[lVar8];
    }
    for (lVar8 = -0x40; lVar8 != 0; lVar8 = lVar8 + 0x10) {
      uVar13 = *(ulong *)((long)nreg.a[0] + lVar8 + 8);
      uVar6 = *(ulong *)((long)nreg.e[0] + lVar8 + 8);
      *(ulong *)((long)nreg.e[0] + lVar8) =
           *(ulong *)((long)nreg.a[0] + lVar8) ^ *(ulong *)((long)nreg.e[0] + lVar8);
      *(ulong *)((long)nreg.e[0] + lVar8 + 8) = uVar13 ^ uVar6;
    }
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 0x10) {
      uVar3 = *(undefined8 *)((long)nreg.f[0] + lVar8 + 8);
      puVar5 = (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.scratchpad
               + lVar8 + uVar12;
      *(undefined8 *)puVar5 = *(undefined8 *)((long)nreg.f[0] + lVar8);
      *(undefined8 *)(puVar5 + 8) = uVar3;
    }
    aVar11 = 0;
    uVar10 = 0;
  }
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    (this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.reg.r[lVar8] =
         nreg.r[lVar8];
  }
  for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 0x10) {
    uVar3 = *(undefined8 *)((long)nreg.f[0] + lVar8 + 8);
    puVar1 = (undefined8 *)
             ((long)&(this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.reg.f
                     [0].lo + lVar8);
    *puVar1 = *(undefined8 *)((long)nreg.f[0] + lVar8);
    puVar1[1] = uVar3;
  }
  for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 0x10) {
    uVar3 = *(undefined8 *)((long)nreg.e[0] + lVar8 + 8);
    puVar1 = (undefined8 *)
             ((long)&(this->super_VmBase<defyx::AlignedAllocator<64UL>,_false>).super_defyx_vm.reg.e
                     [0].lo + lVar8);
    *puVar1 = *(undefined8 *)((long)nreg.e[0] + lVar8);
    puVar1[1] = uVar3;
  }
  return;
}

Assistant:

void InterpretedVm<Allocator, softAes>::execute() {

		NativeRegisterFile nreg;

		for(unsigned i = 0; i < RegisterCountFlt; ++i)
			nreg.a[i] = rx_load_vec_f128(&reg.a[i].lo);

		compileProgram(program, bytecode, nreg);

		uint32_t spAddr0 = mem.mx;
		uint32_t spAddr1 = mem.ma;

		for(unsigned ic = 0; ic < RANDOMX_PROGRAM_ITERATIONS; ++ic) {
			uint64_t spMix = nreg.r[config.readReg0] ^ nreg.r[config.readReg1];
			spAddr0 ^= spMix;
			spAddr0 &= ScratchpadL3Mask64;
			spAddr1 ^= spMix >> 32;
			spAddr1 &= ScratchpadL3Mask64;
			
			for (unsigned i = 0; i < RegistersCount; ++i)
				nreg.r[i] ^= load64(scratchpad + spAddr0 + 8 * i);

			for (unsigned i = 0; i < RegisterCountFlt; ++i)
				nreg.f[i] = rx_cvt_packed_int_vec_f128(scratchpad + spAddr1 + 8 * i);

			for (unsigned i = 0; i < RegisterCountFlt; ++i)
				nreg.e[i] = maskRegisterExponentMantissa(config, rx_cvt_packed_int_vec_f128(scratchpad + spAddr1 + 8 * (RegisterCountFlt + i)));

			executeBytecode(bytecode, scratchpad, config);

			mem.mx ^= nreg.r[config.readReg2] ^ nreg.r[config.readReg3];
			mem.mx &= CacheLineAlignMask;
			datasetPrefetch(datasetOffset + mem.mx);
			datasetRead(datasetOffset + mem.ma, nreg.r);
			std::swap(mem.mx, mem.ma);

			for (unsigned i = 0; i < RegistersCount; ++i)
				store64(scratchpad + spAddr1 + 8 * i, nreg.r[i]);

			for (unsigned i = 0; i < RegisterCountFlt; ++i)
				nreg.f[i] = rx_xor_vec_f128(nreg.f[i], nreg.e[i]);

			for (unsigned i = 0; i < RegisterCountFlt; ++i)
				rx_store_vec_f128((double*)(scratchpad + spAddr0 + 16 * i), nreg.f[i]);

			spAddr0 = 0;
			spAddr1 = 0;
		}

		for (unsigned i = 0; i < RegistersCount; ++i)
			store64(&reg.r[i], nreg.r[i]);

		for (unsigned i = 0; i < RegisterCountFlt; ++i)
			rx_store_vec_f128(&reg.f[i].lo, nreg.f[i]);

		for (unsigned i = 0; i < RegisterCountFlt; ++i)
			rx_store_vec_f128(&reg.e[i].lo, nreg.e[i]);
	}